

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O3

Byte * z7_BranchConv_ARMT_Enc(Byte *data,SizeT size,UInt32 pc)

{
  ushort *puVar1;
  int iVar2;
  ushort *puVar3;
  ushort *puVar4;
  byte bVar5;
  uint uVar6;
  
  if (2 < (size & 0xfffffffffffffffe)) {
    puVar3 = (ushort *)(data + ((size & 0xfffffffffffffffe) - 2));
    iVar2 = (int)data;
    do {
      bVar5 = *(byte *)((long)data + 1);
      puVar1 = (ushort *)((long)data + 2);
      do {
        puVar4 = puVar1;
        if (puVar3 <= puVar4 + -1) {
          return (Byte *)(puVar4 + -1);
        }
        if (0xf7 < ((bVar5 ^ 8) & *(byte *)((long)puVar4 + 1))) goto LAB_0012f874;
        if (puVar3 <= puVar4) {
          return (Byte *)puVar4;
        }
        bVar5 = *(byte *)((long)puVar4 + 3);
        puVar1 = puVar4 + 2;
      } while (((*(byte *)((long)puVar4 + 1) ^ 8) & bVar5) < 0xf8);
      puVar4 = puVar4 + 1;
LAB_0012f874:
      data = (Byte *)(puVar4 + 1);
      uVar6 = ((pc - iVar2) + (int)data >> 1) + (*puVar4 & 0x7ff | (uint)puVar4[-1] << 0xb);
      puVar4[-1] = (ushort)(uVar6 >> 0xb) & 0x7ff | 0xf000;
      *puVar4 = (ushort)uVar6 | 0xf800;
    } while (data < puVar3);
  }
  return data;
}

Assistant:

Z7_BRANCH_FUNCS_IMP(BranchConv_ARMT)


// #define BR_IA64_NO_INLINE

Z7_BRANCH_FUNC_MAIN(BranchConv_IA64)
{
  // Byte *p = data;
  const Byte *lim;
  size &= ~(SizeT)15;
  lim = p + size;
  pc -= 1 << 4;
  pc >>= 4 - 1;
  // pc -= 1 << 1;
  
  for (;;)
  {
    unsigned m;
    for (;;)
    {
      if Z7_UNLIKELY(p == lim)
        return p;
      m = (unsigned)((UInt32)0x334b0000 >> (*p & 0x1e));
      p += 16;
      pc += 1 << 1;
      if (m &= 3)
        break;
    }
    {
      p += (ptrdiff_t)m * 5 - 20; // negative value is expected here.
      do
      {
        const UInt32 t =
          #if defined(MY_CPU_X86_OR_AMD64)
            // we use 32-bit load here to reduce code size on x86:
            GetUi32(p);
          #else
            GetUi16(p);
          #endif
        UInt32 z = GetUi32(p + 1) >> m;
        p += 5;
        if (((t >> m) & (0x70 << 1)) == 0
            && ((z - (0x5000000 << 1)) & (0xf000000 << 1)) == 0)
        {
          UInt32 v = (UInt32)((0x8fffff << 1) | 1) & z;
          z ^= v;
        #ifdef BR_IA64_NO_INLINE
          v |= (v & ((UInt32)1 << (23 + 1))) >> 3;
          {
            UInt32 c = pc;
            BR_CONVERT_VAL(v, c)
          }
          v &= (0x1fffff << 1) | 1;
        #else
          {
            if (encoding)
            {
              // pc &= ~(0xc00000 << 1); // we just need to clear at least 2 bits
              pc &= (0x1fffff << 1) | 1;
              v += pc;
            }
            else
            {
              // pc |= 0xc00000 << 1; // we need to set at least 2 bits
              pc |= ~(UInt32)((0x1fffff << 1) | 1);
              v -= pc;
            }
          }
          v &= ~(UInt32)(0x600000 << 1);
        #endif
          v += (0x700000 << 1);
          v &= (0x8fffff << 1) | 1;
          z |= v;
          z <<= m;
          SetUi32(p + 1 - 5, z)
        }
        m++;
      }
      while (m &= 3); // while (m < 4);
    }
  }
}